

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MappingChannel::Write(ON_MappingChannel *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_MappingChannel *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,1);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteInt(archive,this->m_mapping_channel_id);
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_mapping_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteXform(archive,&this->m_object_xform);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_MappingChannel::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1);
  if (rc)
  {
    rc = archive.WriteInt(m_mapping_channel_id);
    if (rc) rc = archive.WriteUuid(m_mapping_id);

    // 1.1 field added 6 June 2006
    if (rc) rc = archive.WriteXform(m_object_xform);

    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}